

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O2

spv_result_t spvtools::val::ModuleLayoutPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ModuleLayoutSection MVar4;
  Op opcode;
  char *pcVar5;
  DiagnosticStream DStack_1f8;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  MVar4 = ValidationState_t::current_layout_section(_);
  if (kLayoutTypes < MVar4) {
    if (1 < MVar4 - kLayoutFunctionDeclarations) {
      return SPV_SUCCESS;
    }
    DStack_1f8.error_ = anon_unknown_3::FunctionScopedInstructions(_,inst,opcode);
    goto joined_r0x0055c4e0;
  }
  if ((opcode != OpExtInstWithForwardRefsKHR) && (opcode != OpExtInst)) goto LAB_0055c556;
  bVar3 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type);
  if (bVar3) {
    uVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      if (((uVar2 < 0x1e) && ((0x31800000U >> (uVar2 & 0x1f) & 1) != 0)) ||
         ((uVar2 - 0x65 < 4 && (uVar2 - 0x65 != 1)))) goto LAB_0055c546;
    }
    else if ((uVar2 < 0x1e) && ((0x31800000U >> (uVar2 & 0x1f) & 1) != 0)) {
LAB_0055c546:
      bVar3 = ValidationState_t::in_function_body(_);
      if (bVar3) goto LAB_0055c556;
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      std::operator<<((ostream *)&DStack_1f8,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ");
      std::operator<<((ostream *)&DStack_1f8,"of debug info extension must appear in a function ");
      pcVar5 = "body";
      goto LAB_0055c6c4;
    }
    MVar4 = ValidationState_t::current_layout_section(_);
    if ((10 < (int)MVar4) &&
       (MVar4 = ValidationState_t::current_layout_section(_), (int)MVar4 < 0xc)) goto LAB_0055c556;
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
    std::operator<<((ostream *)&DStack_1f8,"Debug info extension instructions other than ");
    std::operator<<((ostream *)&DStack_1f8,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ");
    std::operator<<((ostream *)&DStack_1f8,"must appear between section 9 (types, constants, ");
    std::operator<<((ostream *)&DStack_1f8,"global variables) and section 10 (function ");
    pcVar5 = "declarations)";
  }
  else {
    bVar3 = spvExtInstIsNonSemantic((inst->inst_).ext_inst_type);
    MVar4 = ValidationState_t::current_layout_section(_);
    if (bVar3) {
      if ((int)MVar4 < 0xb) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::operator<<((ostream *)&DStack_1f8,
                        "Non-semantic OpExtInst must not appear before types ");
        pcVar5 = "section";
      }
      else {
LAB_0055c556:
        do {
          while( true ) {
            bVar3 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
            if (bVar3) {
              return SPV_SUCCESS;
            }
            bVar3 = ValidationState_t::IsOpcodeInPreviousLayoutSection(_,opcode);
            if (bVar3) {
              ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
              pcVar5 = spvOpcodeString(opcode);
              std::operator<<((ostream *)&DStack_1f8,pcVar5);
              pcVar5 = " is in an invalid layout section";
              goto LAB_0055c6c4;
            }
            ValidationState_t::ProgressToNextLayoutSectionOrder(_);
            MVar4 = ValidationState_t::current_layout_section(_);
            if (MVar4 == kLayoutMemoryModel) break;
            if (MVar4 == kLayoutFunctionDeclarations) {
              DStack_1f8.error_ = ModuleLayoutPass(_,inst);
              goto joined_r0x0055c4e0;
            }
          }
        } while (uVar1 == 0xe);
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar5 = spvOpcodeString(opcode);
        std::operator<<((ostream *)&DStack_1f8,pcVar5);
        pcVar5 = " cannot appear before the memory model instruction";
      }
    }
    else {
      if (0xc < (int)MVar4) goto LAB_0055c556;
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar5 = spvOpcodeString(opcode);
      std::operator<<((ostream *)&DStack_1f8,pcVar5);
      pcVar5 = " must appear in a block";
    }
  }
LAB_0055c6c4:
  std::operator<<((ostream *)&DStack_1f8,pcVar5);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
joined_r0x0055c4e0:
  if (DStack_1f8.error_ == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ModuleLayoutPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (_.current_layout_section()) {
    case kLayoutCapabilities:
    case kLayoutExtensions:
    case kLayoutExtInstImport:
    case kLayoutMemoryModel:
    case kLayoutSamplerImageAddressMode:
    case kLayoutEntryPoint:
    case kLayoutExecutionMode:
    case kLayoutDebug1:
    case kLayoutDebug2:
    case kLayoutDebug3:
    case kLayoutAnnotations:
    case kLayoutTypes:
      if (auto error = ModuleScopedInstructions(_, inst, opcode)) return error;
      break;
    case kLayoutFunctionDeclarations:
    case kLayoutFunctionDefinitions:
      if (auto error = FunctionScopedInstructions(_, inst, opcode)) {
        return error;
      }
      break;
  }
  return SPV_SUCCESS;
}